

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void new_cb(Fl_Widget *param_1,void *v)

{
  int iVar1;
  FILE *__stream;
  FILE *__s;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  char *in_RCX;
  char *pcVar5;
  Fl_Double_Window *__stat_loc;
  fd_set *in_R8;
  timeval *in_R9;
  char line [1024];
  char local_438 [1032];
  
  if ((v == (void *)0x0) && (modflag != 0)) {
    pcVar5 = "Do you want to save changes to this user\ninterface before creating a new one?";
    in_RCX = "Don\'t Save";
    iVar1 = fl_choice("Do you want to save changes to this user\ninterface before creating a new one?"
                      ,"Cancel","Save","Don\'t Save");
    if (iVar1 == 0) {
      return;
    }
    if ((iVar1 == 1) && (save_cb((Fl_Widget *)pcVar5,(void *)0x0), modflag != 0)) {
      return;
    }
  }
  if (template_panel == (Fl_Double_Window *)0x0) {
    make_template_panel();
  }
  template_clear();
  Fl_Browser::add(template_browser,"Blank",(void *)0x0);
  template_load();
  (*(template_name->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[6])();
  Fl_Input_::value(&template_name->super_Fl_Input_,"");
  (*(template_instance->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[5])();
  Fl_Widget::deactivate((Fl_Widget *)template_instance);
  Fl_Input_::value(&template_instance->super_Fl_Input_,"");
  (*(template_delete->super_Fl_Widget)._vptr_Fl_Widget[6])();
  Fl_Widget::label((Fl_Widget *)template_submit,"New");
  Fl_Widget::deactivate((Fl_Widget *)template_submit);
  Fl_Window::label(&template_panel->super_Fl_Window,"New");
  if (template_browser->lines == 1) {
    Fl_Browser::select(template_browser,1,(fd_set *)&DAT_00000001,(fd_set *)in_RCX,in_R8,in_R9);
    Fl_Widget::do_callback
              ((Fl_Widget *)template_browser,(Fl_Widget *)template_browser,
               (template_browser->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.user_data_);
  }
  __stat_loc = template_panel;
  (*(template_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  while ((template_panel->super_Fl_Window).i != (Fl_X *)0x0) {
    Fl::wait(__stat_loc);
  }
  iVar1 = Fl_Browser::value(template_browser);
  if (iVar1 < 1) {
    return;
  }
  delete_all(0);
  set_filename((char *)0x0);
  pcVar5 = (char *)Fl_Browser::data(template_browser,iVar1);
  if (pcVar5 == (char *)0x0) goto LAB_0019a019;
  pcVar4 = (template_instance->super_Fl_Input_).value_;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    undo_suspend();
    read_file(pcVar5,0);
  }
  else {
    __stream = (FILE *)fl_fopen(pcVar5,"r");
    if (__stream == (FILE *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fl_alert("Error reading template file \"%s\":\n%s",pcVar5,pcVar4);
      goto LAB_0019a019;
    }
    pcVar5 = cutfname(1);
    __s = (FILE *)fl_fopen(pcVar5,"w");
    if (__s == (FILE *)0x0) {
      pcVar5 = cutfname(1);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fl_alert("Error writing buffer file \"%s\":\n%s",pcVar5,pcVar4);
      fclose(__stream);
      goto LAB_0019a019;
    }
    pcVar5 = fgets(local_438,0x400,__stream);
    while (pcVar5 != (char *)0x0) {
      pcVar2 = strstr(local_438,"@INSTANCE@");
      pcVar5 = local_438;
      while (pcVar2 != (char *)0x0) {
        fwrite(pcVar5,(long)pcVar2 - (long)pcVar5,1,__s);
        fputs(pcVar4,__s);
        pcVar5 = pcVar2 + 10;
        pcVar2 = strstr(pcVar5,"@INSTANCE@");
      }
      fputs(pcVar5,__s);
      pcVar5 = fgets(local_438,0x400,__stream);
    }
    fclose(__stream);
    fclose(__s);
    undo_suspend();
    pcVar5 = cutfname(1);
    read_file(pcVar5,0);
    pcVar5 = cutfname(1);
    unlink(pcVar5);
  }
  undo_resume();
LAB_0019a019:
  set_modflag(0);
  undo_clear();
  return;
}

Assistant:

void new_cb(Fl_Widget *, void *v) {
  // Check if the current file has been modified...
  if (!v && modflag) {
    // Yes, ask the user what to do...
    switch (fl_choice("Do you want to save changes to this user\n"
                      "interface before creating a new one?", "Cancel",
                      "Save", "Don't Save"))
    {
      case 0 : /* Cancel */
          return;
      case 1 : /* Save */
          save_cb(NULL, NULL);
	  if (modflag) return;	// Didn't save!
    }
  }

  // Setup the template panel...
  if (!template_panel) make_template_panel();

  template_clear();
  template_browser->add("Blank");
  template_load();

  template_name->hide();
  template_name->value("");

  template_instance->show();
  template_instance->deactivate();
  template_instance->value("");

  template_delete->hide();

  template_submit->label("New");
  template_submit->deactivate();

  template_panel->label("New");

  if ( template_browser->size() == 1 ) { // only one item?
    template_browser->value(1);          // select it
    template_browser->do_callback();
  }

  // Show the panel and wait for the user to do something...
  template_panel->show();
  while (template_panel->shown()) Fl::wait();

  // See if the user chose anything...
  int item = template_browser->value();
  if (item < 1) return;

  // Clear the current data...
  delete_all();
  set_filename(NULL);

  // Load the template, if any...
  const char *tname = (const char *)template_browser->data(item);

  if (tname) {
    // Grab the instance name...
    const char *iname = template_instance->value();

    if (iname && *iname) {
      // Copy the template to a temp file, then read it in...
      char line[1024], *ptr, *next;
      FILE *infile, *outfile;

      if ((infile = fl_fopen(tname, "r")) == NULL) {
	fl_alert("Error reading template file \"%s\":\n%s", tname,
        	 strerror(errno));
	set_modflag(0);
	undo_clear();
	return;
      }

      if ((outfile = fl_fopen(cutfname(1), "w")) == NULL) {
	fl_alert("Error writing buffer file \"%s\":\n%s", cutfname(1),
        	 strerror(errno));
	fclose(infile);
	set_modflag(0);
	undo_clear();
	return;
      }

      while (fgets(line, sizeof(line), infile)) {
	// Replace @INSTANCE@ with the instance name...
	for (ptr = line; (next = strstr(ptr, "@INSTANCE@")) != NULL; ptr = next + 10) {
	  fwrite(ptr, next - ptr, 1, outfile);
	  fputs(iname, outfile);
	}

	fputs(ptr, outfile);
      }

      fclose(infile);
      fclose(outfile);

      undo_suspend();
      read_file(cutfname(1), 0);
      unlink(cutfname(1));
      undo_resume();
    } else {
      // No instance name, so read the template without replacements...
      undo_suspend();
      read_file(tname, 0);
      undo_resume();
    }
  }

  set_modflag(0);
  undo_clear();
}